

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPager;
  sqlite3_mutex *psVar3;
  u8 uVar4;
  uint uVar5;
  
  if (p->inTrans == '\0') {
    return 0;
  }
  sqlite3BtreeEnter(p);
  if (p->inTrans != '\x02') goto LAB_0014c136;
  pBVar2 = p->pBt;
  pPager = pBVar2->pPager;
  uVar5 = pPager->errCode;
  if (uVar5 == 0) {
    if (((pPager->eState == '\x02') && (pPager->exclusiveMode != '\0')) &&
       (pPager->journalMode == '\x01')) {
      uVar5 = 0;
      uVar4 = '\x01';
    }
    else {
      uVar5 = pager_end_transaction(pPager,(uint)pPager->setMaster,1);
      if (((char)uVar5 != '\r') && ((uVar5 & 0xff) != 10)) goto LAB_0014c0e3;
      pPager->errCode = uVar5;
      uVar4 = '\x06';
    }
    pPager->eState = uVar4;
  }
LAB_0014c0e3:
  if (bCleanup == 0 && uVar5 != 0) {
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        psVar3 = p->pBt->mutex;
        if (psVar3 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar3);
        }
        p->locked = '\0';
      }
    }
  }
  else {
    pBVar2->inTransaction = '\x01';
    sqlite3BitvecDestroy(pBVar2->pHasContent);
    pBVar2->pHasContent = (Bitvec *)0x0;
  }
  if (bCleanup == 0 && uVar5 != 0) {
    return uVar5;
  }
LAB_0014c136:
  btreeEndTransaction(p);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar3 = p->pBt->mutex;
      if (psVar3 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      p->locked = '\0';
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees 
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}